

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_Font * __thiscall
ON_ManagedFonts::Internal_AddManagedFont
          (ON_ManagedFonts *this,ON_Font *managed_font,
          ON_FontMetrics *managed_font_metrics_in_font_design_units)

{
  bool bPreferedItalic;
  Member MVar1;
  bool bVar2;
  ON_Font *pOVar3;
  element_type *__p;
  ON_MemoryAllocationTracking disable_tracking;
  ON_FontFaceQuartet default_quartet;
  
  ON_MemoryAllocationTracking::ON_MemoryAllocationTracking(&disable_tracking,false);
  if ((this->m_default_font_ptr == 0) && (managed_font->m_runtime_serial_number == 1)) {
    this->m_default_font_ptr = (ON__UINT_PTR)managed_font;
  }
  InstalledFonts();
  pOVar3 = ON_FontList::FromFontProperties(&List.m_installed_fonts,managed_font,true,true);
  if (pOVar3 == (ON_Font *)0x0) {
    bVar2 = ON_Font::IsBoldInQuartet(managed_font);
    bPreferedItalic = ON_Font::IsItalicInQuartet(managed_font);
    if (managed_font->m_quartet_member == Unset) {
      MVar1 = bPreferedItalic * '\x02' + Regular;
      if (bVar2) {
        MVar1 = bPreferedItalic * '\x02' + Bold;
      }
      managed_font->m_quartet_member = MVar1;
    }
    ON_Font::InstalledFontQuartet(&default_quartet,&ON_Font::Default);
    pOVar3 = ON_FontFaceQuartet::ClosestFace(&default_quartet,bVar2,bPreferedItalic);
    if (pOVar3 == (ON_Font *)0x0) {
      pOVar3 = &ON_Font::Default;
    }
    managed_font->m_managed_installed_font_and_bits = (ulong)pOVar3 | 2;
    ON_wString::~ON_wString(&default_quartet.m_quartet_name);
  }
  else {
    managed_font->m_managed_installed_font_and_bits = (ulong)pOVar3 | 1;
  }
  __p = (managed_font->m_font_glyph_cache).
        super___shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (__p == (element_type *)0x0) {
    __p = ON_FontGlyphCache::New();
    std::__shared_ptr<ON_FontGlyphCache,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<ON_FontGlyphCache,void>
              ((__shared_ptr<ON_FontGlyphCache,(__gnu_cxx::_Lock_policy)2> *)&default_quartet,__p);
    std::__shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(managed_font->m_font_glyph_cache).
                super___shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2> *)&default_quartet);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&default_quartet.m_regular);
  }
  bVar2 = ON_FontMetrics::HeightsAreValid(&__p->m_font_unit_metrics);
  if (bVar2) goto LAB_00494fb7;
  default_quartet.m_bold_italic = (ON_Font *)0x0;
  default_quartet.m_bold = (ON_Font *)0x0;
  default_quartet.m_italic = (ON_Font *)0x0;
  default_quartet.m_quartet_name.m_s = (wchar_t *)0x0;
  default_quartet.m_regular = (ON_Font *)0x0;
  if (managed_font_metrics_in_font_design_units == (ON_FontMetrics *)0x0) {
LAB_00494f9d:
    GetFontMetricsInFontDesignUnits(managed_font,(ON_FontMetrics *)&default_quartet);
  }
  else {
    bVar2 = ON_FontMetrics::HeightsAreValid(managed_font_metrics_in_font_design_units);
    if (!bVar2) goto LAB_00494f9d;
    default_quartet.m_quartet_name.m_s = *(wchar_t **)managed_font_metrics_in_font_design_units;
    default_quartet.m_regular = *(ON_Font **)&managed_font_metrics_in_font_design_units->m_descent;
    default_quartet.m_bold =
         *(ON_Font **)&managed_font_metrics_in_font_design_units->m_ascent_of_capital;
    default_quartet.m_italic =
         *(ON_Font **)&managed_font_metrics_in_font_design_units->m_strikeout_position;
    default_quartet.m_bold_italic =
         *(ON_Font **)&managed_font_metrics_in_font_design_units->m_underscore_position;
  }
  ON_FontGlyphCache::SetFontMetrics(__p,(ON_FontMetrics *)&default_quartet);
LAB_00494fb7:
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_locale_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_postscript_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_en_postscript_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_family_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_en_family_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_face_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_en_face_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_windows_logfont_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_windows_logfont_name);
  ON_FontList::AddFont(&this->m_managed_fonts,managed_font,false);
  ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking(&disable_tracking);
  return managed_font;
}

Assistant:

const ON_Font* ON_ManagedFonts::Internal_AddManagedFont(
  const ON_Font* managed_font,
  const ON_FontMetrics* managed_font_metrics_in_font_design_units
  )
{
  // All memory allocated for managed fonts is permanent app workspace memory.
  ON_MemoryAllocationTracking disable_tracking(false);

  if (0 == m_default_font_ptr && 1 == managed_font->m_runtime_serial_number)
  {
    // ON_Font::Default is constructed after ON_ManagedFonts::List and
    // destroyed before ON_ManagedFonts::List. Therefore ~ON_ManagedFonts()
    // has a pointer to ON_Font::Default that must be ignored during
    // destruction.
    m_default_font_ptr = (ON__UINT_PTR)managed_font;
  }

  const ON_Font* installed_font = InstalledFonts().FromFontProperties(managed_font, true, true);
  if (nullptr != installed_font)
  {
    // This managed font matches an installed font.
    ON_Font::Internal_SetManagedFontInstalledFont(managed_font, installed_font, false);
  }
  else
  {
    // Feb 22, 2021 RH-62974
    // This managed font is not installed on this device.
    // After prototyping several approaches permitting various types
    // of user configured font substitution, Lowell and Dale Lear
    // concluded that using the default font was the best option.
    // If this is a problem for lots of users, then we need a way
    // for users to configure the choice of default font.
    // Current settings:
    // Windows: Arial
    // Apple: Helvetic Neue

    // managed_font is a missing font.
    // We have to substitute the correct quartet member (regular/bold/italic/bold-italic).
    // Since managed_font references a font that is not installed on this device,
    // IsItalicInQuartet() and IsBoldInQuartet() will probably fall through to
    // the fallback best guess sections of those functions.
    const bool bBoldInQuartet = managed_font->IsBoldInQuartet();
    const bool bItalicInQuartet = managed_font->IsItalicInQuartet();
    if (ON_FontFaceQuartet::Member::Unset == managed_font->m_quartet_member)
      managed_font->m_quartet_member = ON_FontFaceQuartet::MemberFromBoldAndItalic(bBoldInQuartet, bItalicInQuartet);

    const ON_FontFaceQuartet default_quartet = ON_Font::Default.InstalledFontQuartet(); // only look at installed quartet!
    installed_font = default_quartet.ClosestFace(bBoldInQuartet, bItalicInQuartet);
    if (nullptr == installed_font)
      installed_font = &ON_Font::Default;
    ON_Font::Internal_SetManagedFontInstalledFont(managed_font, installed_font, true);
  }

  ON_FontGlyphCache* font_cache = managed_font->m_font_glyph_cache.get();
  if (nullptr == font_cache)
  {
    /////////////////////
    //
    // Put the cached glyph information here so we only have one set for each font
    //
    font_cache = ON_FontGlyphCache::New();
    managed_font->m_font_glyph_cache = std::shared_ptr<ON_FontGlyphCache>(font_cache);
  }

  if (nullptr != font_cache)
  {
    if (false == font_cache->m_font_unit_metrics.HeightsAreValid())
    {
      ON_FontMetrics font_metrics_in_font_design_units;

      if (
        nullptr != managed_font_metrics_in_font_design_units
        && managed_font_metrics_in_font_design_units->HeightsAreValid()
        )
      {
        font_metrics_in_font_design_units = *managed_font_metrics_in_font_design_units;
      }
      else
      {
        ON_ManagedFonts::GetFontMetricsInFontDesignUnits(
          managed_font,
          font_metrics_in_font_design_units
        );
      }

      font_cache->SetFontMetrics(font_metrics_in_font_design_units);
    }
  }
  
  // Insulate strings in managed fonts from outside damage.
  Internal_AddManagedFontSingleRefCountString(managed_font->m_locale_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_postscript_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_en_postscript_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_family_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_en_family_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_face_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_en_face_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_windows_logfont_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_windows_logfont_name);

  m_managed_fonts.AddFont(managed_font,false);

  return managed_font;
}